

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

bool GetVarAddrType(AActor *self,FName *varname,int index,void **addr,PType **type,bool readonly)

{
  bool bVar1;
  MetaClass *pMVar2;
  DObject *p;
  PArray *pPVar3;
  PType *local_60;
  BYTE *baddr;
  PArray *arraytype;
  PField *local_48;
  PField *var;
  PType **ppPStack_38;
  bool readonly_local;
  PType **type_local;
  void **addr_local;
  FName *pFStack_20;
  int index_local;
  FName *varname_local;
  AActor *self_local;
  
  var._7_1_ = readonly;
  ppPStack_38 = type;
  type_local = (PType **)addr;
  addr_local._4_4_ = index;
  pFStack_20 = varname;
  varname_local = (FName *)self;
  pMVar2 = AActor::GetClass(self);
  FName::FName((FName *)((long)&arraytype + 4),varname);
  p = (DObject *)
      PSymbolTable::FindSymbol
                (&(pMVar2->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                  super_PCompoundType.super_PType.Symbols,(FName *)((long)&arraytype + 4),true);
  local_48 = dyn_cast<PField>(p);
  if ((local_48 == (PField *)0x0) || (((var._7_1_ & 1) == 0 && ((local_48->Flags & 8) != 0)))) {
    self_local._7_1_ = false;
  }
  else {
    *ppPStack_38 = local_48->Type;
    local_60 = (PType *)((long)&varname_local->Index + local_48->Offset);
    pPVar3 = dyn_cast<PArray>((DObject *)*ppPStack_38);
    if (pPVar3 == (PArray *)0x0) {
      if (addr_local._4_4_ != 0) {
        return false;
      }
    }
    else {
      *ppPStack_38 = pPVar3->ElementType;
      if (pPVar3->ElementCount <= addr_local._4_4_) {
        return false;
      }
      local_60 = (PType *)((long)&(local_60->super_PTypeBase).super_DObject._vptr_DObject +
                          (ulong)(pPVar3->ElementSize * addr_local._4_4_));
    }
    *type_local = local_60;
    bVar1 = DObject::IsA((DObject *)*ppPStack_38,PInt::RegistrationInfo.MyClass);
    if ((bVar1) ||
       (bVar1 = DObject::IsKindOf((DObject *)*ppPStack_38,PFloat::RegistrationInfo.MyClass), bVar1))
    {
      self_local._7_1_ = true;
    }
    else if (((var._7_1_ & 1) == 0) ||
            ((bVar1 = DObject::IsA((DObject *)*ppPStack_38,PName::RegistrationInfo.MyClass), !bVar1
             && (bVar1 = DObject::IsA((DObject *)*ppPStack_38,PString::RegistrationInfo.MyClass),
                !bVar1)))) {
      self_local._7_1_ = false;
    }
    else {
      self_local._7_1_ = true;
    }
  }
  return self_local._7_1_;
}

Assistant:

bool GetVarAddrType(AActor *self, FName varname, int index, void *&addr, PType *&type, bool readonly)
{
	PField *var = dyn_cast<PField>(self->GetClass()->Symbols.FindSymbol(varname, true));
	PArray *arraytype;

	if (var == NULL || (!readonly && (var->Flags & VARF_Native)))
	{
		return false;
	}
	type = var->Type;
	BYTE *baddr = reinterpret_cast<BYTE *>(self) + var->Offset;
	arraytype = dyn_cast<PArray>(type);
	if (arraytype != NULL)
	{
		// unwrap contained type
		type = arraytype->ElementType;
		// offset by index (if in bounds)
		if ((unsigned)index >= arraytype->ElementCount)
		{ // out of bounds
			return false;
		}
		baddr += arraytype->ElementSize * index;
	}
	else if (index != 0)
	{ // ignore attempts to set indexed values on non-arrays
		return false;
	}
	addr = baddr;
	// We don't want Int subclasses like Name or Color to be accessible,
	// but we do want to support Float subclasses like Fixed.
	if (!type->IsA(RUNTIME_CLASS(PInt)) && !type->IsKindOf(RUNTIME_CLASS(PFloat)))
	{
		// For reading, we also support Name and String types.
		if (readonly && (type->IsA(RUNTIME_CLASS(PName)) || type->IsA(RUNTIME_CLASS(PString))))
		{
			return true;
		}
		return false;
	}
	return true;
}